

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<char_const(&)[2],kj::StringPtr&,char_const(&)[17]>
          (String *__return_storage_ptr__,kj *this,char (*params) [2],StringPtr *params_1,
          char (*params_2) [17])

{
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  ArrayPtr<const_char> local_30;
  
  local_30 = toCharSequence<char_const(&)[2]>((char (*) [2])this);
  local_40.ptr = *(char **)params;
  local_40.size_ = *(long *)(params + 4) - 1;
  local_50 = toCharSequence<char_const(&)[17]>((char (*) [17])params_1);
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_30,&local_40,&local_50,
             (ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}